

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDictionary.cpp
# Opt level: O0

bool IDictionary::isOperator1(string *str)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  string *local_220;
  _Self local_188;
  _Self local_180;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_176;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_175;
  undefined1 local_174;
  allocator local_173;
  allocator local_172;
  allocator local_171;
  allocator local_170;
  allocator local_16f;
  allocator local_16e;
  allocator local_16d [20];
  allocator local_159;
  string *local_158;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  operator1;
  string *str_local;
  
  local_174 = 1;
  local_158 = local_150;
  operator1._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"+",&local_159);
  local_158 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"-",local_16d);
  local_158 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"~",&local_16e);
  local_158 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"&",&local_16f);
  local_158 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"!",&local_170);
  local_158 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"++",&local_171);
  local_158 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"--",&local_172);
  local_158 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"*",&local_173);
  local_174 = 0;
  local_50 = (iterator)local_150;
  local_48 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_176);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_40,__l,&local_175,&local_176);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_176);
  local_220 = (string *)&local_50;
  do {
    local_220 = local_220 + -0x20;
    std::__cxx11::string::~string(local_220);
  } while (local_220 != local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_173);
  std::allocator<char>::~allocator((allocator<char> *)&local_172);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::~allocator((allocator<char> *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e);
  std::allocator<char>::~allocator((allocator<char> *)local_16d);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  local_180._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40,str);
  local_188._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
  bVar1 = std::operator!=(&local_180,&local_188);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_40);
  return bVar1;
}

Assistant:

bool IDictionary::isOperator1(std::string str) {
    std::set<std::string> operator1({"+","-","~","&","!","++","--","*"});
    return operator1.find(str)!=operator1.end();
}